

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOrder.c
# Opt level: O0

void Abc_NtkImplementCiOrder(Abc_Ntk_t *pNtk,char *pFileName,int fReverse,int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  FILE *__stream;
  Vec_Ptr_t *p;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vSupp;
  FILE *pFile;
  char Buffer [1000];
  int fVerbose_local;
  int fReverse_local;
  char *pFileName_local;
  Abc_Ntk_t *pNtk_local;
  
  Buffer._992_4_ = fVerbose;
  Buffer._996_4_ = fReverse;
  __stream = fopen(pFileName,"r");
  iVar1 = Abc_NtkCiNum(pNtk);
  p = Vec_PtrAlloc(iVar1);
  while( true ) {
    iVar1 = __isoc99_fscanf(__stream,"%s",&pFile);
    if (iVar1 != 1) {
      fclose(__stream);
      iVar1 = Vec_PtrSize(p);
      iVar2 = Abc_NtkCiNum(pNtk);
      if (iVar1 == iVar2) {
        Abc_NtkChangeCiOrder(pNtk,p,Buffer._996_4_);
        Vec_PtrFree(p);
      }
      else {
        uVar3 = Vec_PtrSize(p);
        uVar4 = Abc_NtkCiNum(pNtk);
        printf("The number of names in the order (%d) is not the same as the number of PIs (%d).\n",
               (ulong)uVar3,(ulong)uVar4);
        Vec_PtrFree(p);
      }
      return;
    }
    pObj_00 = Abc_NtkFindCi(pNtk,(char *)&pFile);
    if ((pObj_00 == (Abc_Obj_t *)0x0) || (iVar1 = Abc_ObjIsCi(pObj_00), iVar1 == 0)) break;
    Vec_PtrPush(p,pObj_00);
  }
  printf("Name \"%s\" is not a PI name. Cannot use this order.\n",&pFile);
  Vec_PtrFree(p);
  fclose(__stream);
  return;
}

Assistant:

void Abc_NtkImplementCiOrder( Abc_Ntk_t * pNtk, char * pFileName, int fReverse, int fVerbose )
{
    char Buffer[1000];
    FILE * pFile;
    Vec_Ptr_t * vSupp;
    Abc_Obj_t * pObj;
    pFile = fopen( pFileName, "r" );
    vSupp = Vec_PtrAlloc( Abc_NtkCiNum(pNtk) );
    while ( fscanf( pFile, "%s", Buffer ) == 1 )
    {
        pObj = Abc_NtkFindCi( pNtk, Buffer );
        if ( pObj == NULL || !Abc_ObjIsCi(pObj) )
        {
            printf( "Name \"%s\" is not a PI name. Cannot use this order.\n", Buffer );
            Vec_PtrFree( vSupp );
            fclose( pFile );
            return;
        }
        Vec_PtrPush( vSupp, pObj );
    }
    fclose( pFile );
    if ( Vec_PtrSize(vSupp) != Abc_NtkCiNum(pNtk) )
    {
        printf( "The number of names in the order (%d) is not the same as the number of PIs (%d).\n", Vec_PtrSize(vSupp), Abc_NtkCiNum(pNtk) );
        Vec_PtrFree( vSupp );
        return;
    }
    Abc_NtkChangeCiOrder( pNtk, vSupp, fReverse );
    Vec_PtrFree( vSupp );
}